

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::ProtobufFrameworkImportSymbol
                   (string *__return_storage_ptr__,string *framework_name)

{
  string local_50;
  allocator local_1a;
  undefined1 local_19;
  string *local_18;
  string *framework_name_local;
  string *result;
  
  local_19 = 0;
  local_18 = framework_name;
  framework_name_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"GPB_USE_",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  ToUpper(&local_50,local_18);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"_FRAMEWORK_IMPORTS");
  return __return_storage_ptr__;
}

Assistant:

string ProtobufFrameworkImportSymbol(const string& framework_name) {
  // GPB_USE_[framework_name]_FRAMEWORK_IMPORTS
  string result = string("GPB_USE_");
  result += ToUpper(framework_name);
  result += "_FRAMEWORK_IMPORTS";
  return result;
}